

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

DirHandle * tryOpenDir(PHYSFS_Io *io,PHYSFS_Archiver *funcs,char *d,int forWriting,int *_claimed)

{
  int iVar1;
  void *pvVar2;
  void *opaque;
  DirHandle *retval;
  int *_claimed_local;
  int forWriting_local;
  char *d_local;
  PHYSFS_Archiver *funcs_local;
  PHYSFS_Io *io_local;
  
  opaque = (void *)0x0;
  if ((io == (PHYSFS_Io *)0x0) || (iVar1 = (*io->seek)(io,0), iVar1 != 0)) {
    pvVar2 = (*funcs->openArchive)(io,d,forWriting,_claimed);
    if (pvVar2 != (void *)0x0) {
      opaque = (*__PHYSFS_AllocatorHooks.Malloc)(0x38);
      if ((undefined8 *)opaque == (undefined8 *)0x0) {
        (*funcs->closeArchive)(pvVar2);
      }
      else {
        memset(opaque,0,0x38);
        *(undefined8 *)((long)opaque + 0x10) = 0;
        *(PHYSFS_Archiver **)((long)opaque + 0x28) = funcs;
        *(void **)opaque = pvVar2;
      }
    }
    io_local = (PHYSFS_Io *)opaque;
  }
  else {
    io_local = (PHYSFS_Io *)0x0;
  }
  return (DirHandle *)io_local;
}

Assistant:

static DirHandle *tryOpenDir(PHYSFS_Io *io, const PHYSFS_Archiver *funcs,
                             const char *d, int forWriting, int *_claimed)
{
    DirHandle *retval = NULL;
    void *opaque = NULL;

    if (io != NULL)
        BAIL_IF_ERRPASS(!io->seek(io, 0), NULL);

    opaque = funcs->openArchive(io, d, forWriting, _claimed);
    if (opaque != NULL)
    {
        retval = (DirHandle *) allocator.Malloc(sizeof (DirHandle));
        if (retval == NULL)
            funcs->closeArchive(opaque);
        else
        {
            memset(retval, '\0', sizeof (DirHandle));
            retval->mountPoint = NULL;
            retval->funcs = funcs;
            retval->opaque = opaque;
        } /* else */
    } /* if */

    return retval;
}